

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

void resetDelaunayTriangulation(DelaunayTriangulation *delTri)

{
  int iVar1;
  Edge *pEVar2;
  double dVar3;
  
  if (delTri->edges != (Edge *)0x0) {
    free(delTri->edges);
  }
  if (delTri->n_points == 0) {
    iVar1 = 0;
  }
  else {
    dVar3 = log((double)delTri->n_points);
    dVar3 = ceil(dVar3 * 3.0 * (double)delTri->n_points);
    iVar1 = (int)dVar3;
  }
  delTri->n_edges_max = iVar1;
  delTri->n_edges = 0;
  delTri->n_edges_discarded = 0;
  pEVar2 = (Edge *)malloc((long)iVar1 * 0x28);
  delTri->edges = pEVar2;
  if ((pEVar2 == (Edge *)0x0) && (1 < delTri->n_points)) {
    puts("ERROR: Couldn\'t allocate memory for edges");
    free(delTri);
    exit(1);
  }
  delTri->success = 0;
  return;
}

Assistant:

void resetDelaunayTriangulation(DelaunayTriangulation *delTri) {
	if (delTri->edges != NULL) {
		free(delTri->edges);
	}

	// (Half) Edges
	if (delTri->n_points == 0) {
		delTri->n_edges_max = 0;
	}
	else {
		delTri->n_edges_max = (GLsizei) ceil((log(delTri->n_points) * 3 * delTri->n_points));
	}

	delTri->n_edges = 0;
	delTri->n_edges_discarded = 0;
	delTri->edges = malloc(sizeof(Edge) * delTri->n_edges_max);

	if ((delTri->edges == NULL) && (delTri->n_points > 1)) {
		printf("ERROR: Couldn't allocate memory for edges\n");
		free(delTri);
		exit(1);
	}

	delTri->success = 0;
}